

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteTargetRebuildManifest(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmOutputConverter *this_00;
  cmLocalGenerator *this_01;
  cmGeneratedFileStream *os_00;
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  mapped_type *pmVar6;
  pointer ppcVar7;
  allocator local_300;
  allocator local_2ff;
  allocator local_2fe;
  allocator local_2fd;
  allocator local_2fc;
  allocator local_2fb;
  allocator local_2fa;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [32];
  _Base_ptr local_278;
  size_t local_270;
  cmNinjaDeps implicitDeps;
  string local_248;
  ostream *local_220;
  cmNinjaVars variables;
  string local_1e8;
  string local_1c8;
  ostringstream cmd;
  
  this_01 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_220 = os;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmd);
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  this_00 = &this_01->super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)&variables,this_00,psVar3,SHELL);
  poVar4 = std::operator<<((ostream *)&cmd,(string *)&variables);
  poVar4 = std::operator<<(poVar4," -H");
  pcVar5 = cmLocalGenerator::GetSourceDirectory(this_01);
  std::__cxx11::string::string((string *)&local_2f8,pcVar5,(allocator *)&implicitDeps);
  cmOutputConverter::ConvertToOutputFormat((string *)local_298,this_00,&local_2f8,SHELL);
  poVar4 = std::operator<<(poVar4,(string *)local_298);
  poVar4 = std::operator<<(poVar4," -B");
  pcVar5 = cmLocalGenerator::GetBinaryDirectory(this_01);
  std::__cxx11::string::string((string *)&local_2d8,pcVar5,(allocator *)&local_248);
  cmOutputConverter::ConvertToOutputFormat(&local_2b8,this_00,&local_2d8,SHELL);
  std::operator<<(poVar4,(string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&variables);
  os_00 = this->RulesFileStream;
  std::__cxx11::string::string((string *)&variables,"RERUN_CMAKE",&local_2fd);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_2f8,"Re-running CMake...",&local_2fe);
  std::__cxx11::string::string((string *)&local_2b8,"Rule for re-running cmake.",&local_2ff);
  std::__cxx11::string::string((string *)&local_2d8,"",&local_300);
  std::__cxx11::string::string((string *)&implicitDeps,"",&local_2f9);
  std::__cxx11::string::string((string *)&local_248,"",&local_2fa);
  std::__cxx11::string::string((string *)&local_1c8,"",&local_2fb);
  std::__cxx11::string::string((string *)&local_1e8,"",&local_2fc);
  WriteRule((ostream *)os_00,(string *)&variables,(string *)local_298,&local_2f8,&local_2b8,
            &local_2d8,(string *)&implicitDeps,&local_248,&local_1c8,&local_1e8,true);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&implicitDeps);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::~string((string *)&variables);
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  implicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (ppcVar7 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppcVar7 !=
      (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
    pcVar1 = (*ppcVar7)->Makefile;
    for (psVar3 = (pcVar1->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar3 != (pcVar1->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
      ConvertToNinjaPath((string *)&variables,this,psVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&implicitDeps,
                 (string *)&variables);
      std::__cxx11::string::~string((string *)&variables);
    }
  }
  std::__cxx11::string::string((string *)&variables,"CMakeCache.txt",(allocator *)local_298);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&implicitDeps,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variables);
  std::__cxx11::string::~string((string *)&variables);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             implicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (implicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       implicitDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&implicitDeps,(const_iterator)__first._M_current,
          (const_iterator)
          implicitDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = SupportsConsolePool(this);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_298,"pool",(allocator *)&local_2f8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&variables,(key_type *)local_298);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)local_298);
  }
  std::__cxx11::string::string
            ((string *)local_298,"Re-run CMake if any of its inputs changed.",&local_2fd);
  std::__cxx11::string::string((string *)&local_2f8,"RERUN_CMAKE",&local_2fe);
  std::__cxx11::string::string((string *)&local_2b8,NINJA_BUILD_FILE,&local_2ff);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_248,1,&local_2b8,(allocator_type *)&local_300);
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1e8.field_2._M_allocated_capacity = 0;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity =
       local_2d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  WriteBuild(this,local_220,(string *)local_298,&local_2f8,(cmNinjaDeps *)&local_248,
             (cmNinjaDeps *)&local_1c8,&implicitDeps,(cmNinjaDeps *)&local_1e8,&variables,&local_2d8
             ,-1,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::string::string
            ((string *)&local_2f8,"A missing CMake input file is not an error.",
             (allocator *)&local_1c8);
  local_2b8.field_2._M_allocated_capacity = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  local_2b8._M_dataplus._M_p = (pointer)0x0;
  local_2b8._M_string_length = 0;
  local_248.field_2._M_allocated_capacity = 0;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_248._M_dataplus._M_p = (pointer)0x0;
  local_248._M_string_length = 0;
  local_298._24_8_ = local_298 + 8;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = 0;
  local_298._16_8_ = 0;
  local_270 = 0;
  local_278 = (_Base_ptr)local_298._24_8_;
  WritePhonyBuild(this,local_220,&local_2f8,&implicitDeps,(cmNinjaDeps *)&local_2b8,
                  (cmNinjaDeps *)&local_2d8,(cmNinjaDeps *)&local_248,(cmNinjaVars *)local_298);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmd);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetRebuildManifest(std::ostream& os)
{
  cmLocalGenerator *lg = this->LocalGenerators[0];

  std::ostringstream cmd;
  cmd << lg->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                   cmLocalGenerator::SHELL)
      << " -H"
      << lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                   cmLocalGenerator::SHELL)
      << " -B"
      << lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                   cmLocalGenerator::SHELL);
  WriteRule(*this->RulesFileStream,
            "RERUN_CMAKE",
            cmd.str(),
            "Re-running CMake...",
            "Rule for re-running cmake.",
            /*depfile=*/ "",
            /*deptype=*/ "",
            /*rspfile=*/ "",
            /*rspcontent*/ "",
            /*restat=*/ "",
            /*generator=*/ true);

  cmNinjaDeps implicitDeps;
  for(std::vector<cmLocalGenerator*>::const_iterator i =
        this->LocalGenerators.begin(); i != this->LocalGenerators.end(); ++i)
    {
    std::vector<std::string> const& lf = (*i)->GetMakefile()->GetListFiles();
    for(std::vector<std::string>::const_iterator fi = lf.begin();
        fi != lf.end(); ++fi)
      {
      implicitDeps.push_back(this->ConvertToNinjaPath(*fi));
      }
    }
  implicitDeps.push_back("CMakeCache.txt");

  std::sort(implicitDeps.begin(), implicitDeps.end());
  implicitDeps.erase(std::unique(implicitDeps.begin(), implicitDeps.end()),
                     implicitDeps.end());

  cmNinjaVars variables;
  // Use 'console' pool to get non buffered output of the CMake re-run call
  // Available since Ninja 1.5
  if(SupportsConsolePool())
    {
    variables["pool"] = "console";
    }

  this->WriteBuild(os,
                   "Re-run CMake if any of its inputs changed.",
                   "RERUN_CMAKE",
                   /*outputs=*/ cmNinjaDeps(1, NINJA_BUILD_FILE),
                   /*explicitDeps=*/ cmNinjaDeps(),
                   implicitDeps,
                   /*orderOnlyDeps=*/ cmNinjaDeps(),
                   variables);

  this->WritePhonyBuild(os,
                        "A missing CMake input file is not an error.",
                        implicitDeps,
                        cmNinjaDeps());
}